

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

int __thiscall
FNodeBuilder::FVertexMapSimple::SelectVertexExact(FVertexMapSimple *this,FPrivVert *vert)

{
  FPrivVert *pFVar1;
  uint uVar2;
  FNodeBuilder *pFVar3;
  DWORD DVar4;
  DWORD DVar5;
  ulong uVar6;
  ulong uVar7;
  fixed_t *pfVar8;
  
  pFVar3 = this->MyBuilder;
  uVar7 = (ulong)(pFVar3->Vertices).Count;
  if (uVar7 != 0) {
    pfVar8 = &(((pFVar3->Vertices).Array)->super_FSimpleVert).y;
    uVar6 = 0;
    do {
      if ((((FSimpleVert *)(pfVar8 + -1))->x == (vert->super_FSimpleVert).x) &&
         (*pfVar8 == (vert->super_FSimpleVert).y)) goto LAB_003aa4fa;
      uVar6 = uVar6 + 1;
      pfVar8 = pfVar8 + 4;
    } while (uVar7 != uVar6);
  }
  vert->segs = 0xffffffff;
  vert->segs2 = 0xffffffff;
  TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Grow(&pFVar3->Vertices,1);
  DVar4 = vert->segs;
  DVar5 = vert->segs2;
  pFVar1 = (pFVar3->Vertices).Array + (pFVar3->Vertices).Count;
  pFVar1->super_FSimpleVert = vert->super_FSimpleVert;
  pFVar1->segs = DVar4;
  pFVar1->segs2 = DVar5;
  uVar2 = (pFVar3->Vertices).Count;
  uVar6 = (ulong)uVar2;
  (pFVar3->Vertices).Count = uVar2 + 1;
LAB_003aa4fa:
  return (int)uVar6;
}

Assistant:

int FNodeBuilder::FVertexMapSimple::SelectVertexExact(FNodeBuilder::FPrivVert &vert)
{
	FPrivVert *verts = &MyBuilder.Vertices[0];
	unsigned int stop = MyBuilder.Vertices.Size();

	for (unsigned int i = 0; i < stop; ++i)
	{
		if (verts[i].x == vert.x && verts[i].y == vert.y)
		{
			return i;
		}
	}
	// Not present: add it!
	return InsertVertex(vert);
}